

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O2

void __thiscall Sound_Queue::fill_buffer(Sound_Queue *this,Uint8 *out,int count)

{
  uint uVar1;
  sample_t *__src;
  
  uVar1 = SDL_SemValue(this->free_sem);
  if (uVar1 < 2) {
    __src = buf(this,this->read_buf);
    memcpy(out,__src,(long)count);
    this->read_buf = (this->read_buf + 1) % 3;
    SDL_SemPost(this->free_sem);
    return;
  }
  memset(out,0,(long)count);
  return;
}

Assistant:

void Sound_Queue::fill_buffer( Uint8* out, int count )
{
	if ( SDL_SemValue( free_sem ) < buf_count - 1 )
	{
		memcpy( out, buf( read_buf ), count );
		read_buf = (read_buf + 1) % buf_count;
		SDL_SemPost( free_sem );
	}
	else
	{
		memset( out, 0, count );
	}
}